

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  IdlNamer *pIVar1;
  BaseType BVar2;
  pointer ppEVar3;
  EnumVal *pEVar4;
  pointer pcVar5;
  long lVar6;
  string *psVar7;
  Import *pIVar8;
  long *plVar9;
  size_type *psVar10;
  pointer ppEVar11;
  Import import;
  string result;
  string local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  PythonStubGenerator *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  Imports *local_78;
  string local_70;
  string local_50;
  
  local_e8.field_2._M_allocated_capacity._0_4_ = 0x69707974;
  local_e8.field_2._M_allocated_capacity._4_2_ = 0x676e;
  local_e8._M_string_length = 6;
  local_e8.field_2._M_local_buf[6] = '\0';
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_a8 = (PythonStubGenerator *)this;
  local_78 = imports;
  Imports::Import(imports,&local_e8);
  local_80 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT17(local_e8.field_2._M_local_buf[7],
                             CONCAT16(local_e8.field_2._M_local_buf[6],
                                      CONCAT24(local_e8.field_2._M_allocated_capacity._4_2_,
                                               local_e8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  ppEVar11 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar3 = (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar11 != ppEVar3) {
    pIVar1 = &local_a8->namer_;
    do {
      pEVar4 = *ppEVar11;
      if (local_a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      BVar2 = (pEVar4->union_type).base_type;
      if ((BVar2 == BASE_TYPE_NONE) || (BVar2 == BASE_TYPE_STRING)) {
        std::__cxx11::string::append((char *)&local_a0);
      }
      else if (BVar2 == BASE_TYPE_STRUCT) {
        anon_unknown_0::PythonStubGenerator::ModuleFor<flatbuffers::StructDef>
                  (&local_70,local_a8,(pEVar4->union_type).struct_def);
        (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_50,pIVar1,(pEVar4->union_type).struct_def);
        pIVar8 = Imports::Import(local_78,&local_70,&local_50);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        pcVar5 = (pIVar8->module)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar5,pcVar5 + (pIVar8->module)._M_string_length);
        local_c8[0] = local_b8;
        pcVar5 = (pIVar8->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,pcVar5,pcVar5 + (pIVar8->name)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c8[0]);
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT17(local_e8.field_2._M_local_buf[7],
                                   CONCAT16(local_e8.field_2._M_local_buf[6],
                                            CONCAT24(local_e8.field_2._M_allocated_capacity._4_2_,
                                                     local_e8.field_2._M_allocated_capacity._0_4_)))
                          + 1);
        }
      }
      ppEVar11 = ppEVar11 + 1;
    } while (ppEVar11 != ppEVar3);
  }
  std::operator+(&local_e8,"typing.Union[",&local_a0);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
  psVar7 = local_80;
  (local_80->_M_dataplus)._M_p = (pointer)&local_80->field_2;
  psVar10 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar10) {
    lVar6 = plVar9[3];
    (local_80->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_80->field_2 + 8) = lVar6;
  }
  else {
    (local_80->_M_dataplus)._M_p = (pointer)*plVar9;
    (local_80->field_2)._M_allocated_capacity = *psVar10;
  }
  local_80->_M_string_length = plVar9[1];
  *plVar9 = (long)psVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT17(local_e8.field_2._M_local_buf[7],
                             CONCAT16(local_e8.field_2._M_local_buf[6],
                                      CONCAT24(local_e8.field_2._M_allocated_capacity._4_2_,
                                               local_e8.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return psVar7;
}

Assistant:

std::string UnionType(const EnumDef &enum_def, Imports *imports) const {
    return UnionType(enum_def, imports, [this](const StructDef &struct_def) {
      return namer_.Type(struct_def);
    });
  }